

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_32s_C4P4(OPJ_INT32 *pSrc,OPJ_INT32 **pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_SIZE_T OVar6;
  
  if (length != 0) {
    pOVar1 = *pDst;
    pOVar2 = pDst[1];
    pOVar3 = pDst[2];
    pOVar4 = pDst[3];
    pOVar5 = pSrc + 3;
    OVar6 = 0;
    do {
      pOVar1[OVar6] = pOVar5[-3];
      pOVar2[OVar6] = pOVar5[-2];
      pOVar3[OVar6] = pOVar5[-1];
      pOVar4[OVar6] = *pOVar5;
      OVar6 = OVar6 + 1;
      pOVar5 = pOVar5 + 4;
    } while (length != OVar6);
  }
  return;
}

Assistant:

static void convert_32s_C4P4(const OPJ_INT32* pSrc, OPJ_INT32* const* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	OPJ_INT32* pDst0 = pDst[0];
	OPJ_INT32* pDst1 = pDst[1];
	OPJ_INT32* pDst2 = pDst[2];
	OPJ_INT32* pDst3 = pDst[3];
	
	for (i = 0; i < length; i++) {
		pDst0[i] = pSrc[4*i+0];
		pDst1[i] = pSrc[4*i+1];
		pDst2[i] = pSrc[4*i+2];
		pDst3[i] = pSrc[4*i+3];
	}
}